

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O0

void __thiscall Simplex::checkBasis(Simplex *this)

{
  longdouble lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  Simplex *pSVar5;
  int *piVar6;
  longdouble *plVar7;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int k;
  longdouble sum;
  int j;
  int i;
  longdouble *temp;
  int in_stack_ffffffffffffffa4;
  longdouble *in_stack_ffffffffffffffa8;
  Simplex *in_stack_ffffffffffffffb0;
  int local_2c;
  longdouble local_28;
  uint local_18;
  uint local_14;
  
  fprintf(_stderr,"Check basis:\n");
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)(in_RDI + 4);
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pSVar5 = (Simplex *)operator_new__(uVar4);
  for (local_14 = 0; (int)local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    calcBInvRow(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    for (local_18 = 0; (int)local_18 < *(int *)(in_RDI + 4); local_18 = local_18 + 1) {
      local_28 = (longdouble)0;
      for (local_2c = 0;
          local_2c <
          *(int *)(*(long *)(in_RDI + 0x38) +
                  (long)*(int *)(*(long *)(in_RDI + 0x138) + (long)(int)local_18 * 4) * 4);
          local_2c = local_2c + 1) {
        in_stack_ffffffffffffffb0 = pSVar5;
        piVar6 = (int *)IndexVal::index((IndexVal *)
                                        (*(long *)(*(long *)(in_RDI + 0x18) +
                                                  (long)*(int *)(*(long *)(in_RDI + 0x138) +
                                                                (long)(int)local_18 * 4) * 8) +
                                        (long)local_2c * 0x10),(char *)(long)(int)local_18,local_18)
        ;
        lVar1 = *(longdouble *)(&in_stack_ffffffffffffffb0->n + (long)*piVar6 * 4);
        plVar7 = IndexVal::val((IndexVal *)
                               (*(long *)(*(long *)(in_RDI + 0x18) +
                                         (long)*(int *)(*(long *)(in_RDI + 0x138) +
                                                       (long)(int)local_18 * 4) * 8) +
                               (long)local_2c * 0x10));
        local_28 = lVar1 * *plVar7 + local_28;
      }
      if (local_14 == local_18) {
        local_28 = -(longdouble)1 + local_28;
      }
      bVar3 = almostZero6(local_28);
      if (!bVar3) {
        fprintf(_stderr,"%d:%d:%.2Lf ",(ulong)local_14,(ulong)local_18,in_R8,in_R9,local_28);
      }
    }
  }
  if (pSVar5 != (Simplex *)0x0) {
    operator_delete__(pSVar5);
  }
  return;
}

Assistant:

void Simplex::checkBasis() {
	//	printTableau(true);
	fprintf(stderr, "Check basis:\n");
	//	long double temp[m];
	auto* temp = new long double[m];
	for (int i = 0; i < m; i++) {
		calcBInvRow(temp, i);
		for (int j = 0; j < m; j++) {
			long double sum = 0;
			for (int k = 0; k < AV_nz[rtoc[j]]; k++) {
				sum += temp[AV[rtoc[j]][k].index()] * AV[rtoc[j]][k].val();
			}
			if (i == j) {
				sum -= 1;
			}
			if (!almostZero6(sum)) {
				fprintf(stderr, "%d:%d:%.2Lf ", i, j, sum);
			}
			assert(almostZero6(sum));
		}
		//		fprintf(stderr, "\n");
	}
	delete[] temp;
}